

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu_v2.c
# Opt level: O1

MPP_RET h264e_vepu_mbrc_prepare(HalH264eVepuMbRcCtx ctx,HalH264eVepuMbRc *mbrc,EncRcTask *rc_task)

{
  RK_S32 RVar1;
  uint uVar2;
  RK_S32 RVar3;
  uint uVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  
  iVar6 = *(int *)((long)ctx + 0x14);
  mbrc->qp_init = (rc_task->info).quality_target;
  mbrc->qp_min = (rc_task->info).quality_min;
  mbrc->qp_max = (rc_task->info).quality_max;
  mbrc->mad_qp_change = 0;
  mbrc->mad_threshold = 0;
  mbrc->cp_distance_mbs = 0;
  if (*(int *)((long)ctx + 0x1c) != 0) {
    *(undefined4 *)((long)ctx + 0x54) = *(undefined4 *)((long)ctx + 0x50);
    *(uint *)((long)ctx + 0x50) = *(uint *)&rc_task->frm >> 3 & 2;
    if (mbrc->rlc_count == 0) {
      mbrc->rlc_count = 1;
    }
    RVar1 = axb_div_c(mbrc->out_strm_size << 3,0x100,mbrc->rlc_count);
    if (RVar1 != 0 && ((ulong)rc_task->frm & 0x10) == 0) {
      uVar7 = iVar6 * 0x180;
      uVar2 = axb_div_c((rc_task->info).bit_target,0x100,RVar1);
      uVar4 = 0;
      if (0 < (int)uVar2) {
        uVar4 = uVar2;
      }
      if ((int)uVar7 < (int)uVar4) {
        uVar4 = uVar7;
      }
      if (uVar4 != 0) {
        uVar7 = 0x1fffff;
        if (uVar4 < 0x1fffff) {
          uVar7 = uVar4;
        }
        RVar3 = axb_div_c(uVar7,0x100,*(RK_S32 *)((long)ctx + 0x14));
        if ((*(int *)((long)ctx + 0x50) == *(int *)((long)ctx + 0x54)) && (mbrc->rlc_count != 0)) {
          lVar5 = 0;
          do {
            iVar8 = mbrc->cp_usage[lVar5] * RVar3;
            iVar6 = 0xffff;
            if (iVar8 < 0x1fffc000) {
              iVar6 = iVar8 + 0x1fff;
              if (-1 < iVar8) {
                iVar6 = iVar8;
              }
              iVar6 = (iVar6 >> 0xd) + 1;
            }
            if (iVar6 < 0) {
              iVar6 = 0xffff;
            }
            mbrc->cp_target[lVar5] = iVar6;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 10);
        }
        else {
          lVar5 = 4;
          do {
            iVar8 = (((int)lVar5 + -3) * *(int *)((long)ctx + 0x48) + 1) * RVar3;
            iVar6 = 0xffff;
            if (iVar8 < 0x1fffc000) {
              iVar6 = iVar8 + 0x1fff;
              if (-1 < iVar8) {
                iVar6 = iVar8;
              }
              iVar6 = (iVar6 >> 0xd) + 1;
            }
            if (iVar6 < 0) {
              iVar6 = 0xffff;
            }
            mbrc->cp_target[lVar5 + -4] = iVar6;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0xe);
        }
        RVar1 = axb_div_c(*(RK_S32 *)((long)ctx + 0x18),0x100,RVar1);
        mbrc->cp_error[0] = RVar1 * -3;
        mbrc->cp_delta_qp[0] = 3;
        mbrc->cp_error[1] = RVar1 * -2;
        mbrc->cp_delta_qp[1] = 2;
        mbrc->cp_delta_qp[2] = 1;
        mbrc->cp_error[2] = -RVar1;
        mbrc->cp_error[3] = RVar1;
        mbrc->cp_delta_qp[3] = 0;
        mbrc->cp_delta_qp[4] = -1;
        mbrc->cp_error[4] = RVar1 * 2;
        mbrc->cp_error[5] = RVar1 * 3;
        mbrc->cp_delta_qp[5] = -2;
        mbrc->cp_delta_qp[6] = -3;
        mbrc->cp_error[6] = RVar1 << 2;
        lVar5 = 0;
        do {
          iVar6 = mbrc->cp_error[lVar5];
          iVar8 = iVar6 + 3;
          if (-1 < iVar6) {
            iVar8 = iVar6;
          }
          iVar6 = iVar8 >> 2;
          if (0x7ffe < iVar8 >> 2) {
            iVar6 = 0x7fff;
          }
          if (iVar6 < -0x7fff) {
            iVar6 = -0x8000;
          }
          mbrc->cp_error[lVar5] = iVar6;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 7);
        mbrc->cp_distance_mbs = *(RK_S32 *)((long)ctx + 0x48);
      }
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET h264e_vepu_mbrc_prepare(HalH264eVepuMbRcCtx ctx, HalH264eVepuMbRc *mbrc,
                                EncRcTask *rc_task)
{
    HalH264eVepuMbRcImpl *p = (HalH264eVepuMbRcImpl *)ctx;
    EncFrmStatus *frm = &rc_task->frm;
    EncRcTaskInfo *info = &rc_task->info;

    RK_S32 i;
    const RK_S32 sscale = 256;
    RK_S32 scaler, srcPrm;
    RK_S32 tmp, nonZeroTarget;
    RK_S32 coeffCntMax = p->mbs * 24 * 16;

    mbrc->qp_init = info->quality_target;
    mbrc->qp_min = info->quality_min;
    mbrc->qp_max = info->quality_max;
    mbrc->mad_qp_change = 0;
    mbrc->mad_threshold = 0;
    mbrc->cp_distance_mbs = 0;

    if (!p->mb_bit_rc_enable)
        return MPP_OK;

    p->pre_frame_type = p->frame_type;
    p->frame_type = (frm->is_intra) ? INTRA_FRAME : INTER_P_FRAME;

    if (mbrc->rlc_count == 0) {
        mbrc->rlc_count = 1;
    }

    srcPrm = axb_div_c(mbrc->out_strm_size * 8, 256, mbrc->rlc_count);
    /* Disable Mb Rc for Intra Slices, because coeffTarget will be wrong */
    if (frm->is_intra || srcPrm == 0)
        return 0;

    /* Required zero cnt */
    nonZeroTarget = axb_div_c(info->bit_target, 256, srcPrm);
    nonZeroTarget = MPP_MIN(coeffCntMax, MPP_MAX(0, nonZeroTarget));
    nonZeroTarget = MPP_MIN(0x7FFFFFFFU / 1024U, (RK_U32)nonZeroTarget);

    if (nonZeroTarget > 0) {
        scaler = axb_div_c(nonZeroTarget, sscale, (RK_S32) p->mbs);
    } else {
        return 0;
    }

    if ((p->frame_type != p->pre_frame_type) || (mbrc->rlc_count == 0)) {
        for (i = 0; i < VEPU_CHECK_POINTS_MAX; i++) {
            tmp = (scaler * (p->check_point_distance * (i + 1) + 1)) / sscale;
            tmp = MPP_MIN(WORD_CNT_MAX, tmp / 32 + 1);
            if (tmp < 0) tmp = WORD_CNT_MAX;    /* Detect overflow */
            mbrc->cp_target[i] = tmp; /* div32 for regs */
        }

        tmp = axb_div_c(p->bits_per_pic, 256, srcPrm);
    } else {
        for (i = 0; i < VEPU_CHECK_POINTS_MAX; i++) {
            tmp = (RK_S32) (mbrc->cp_usage[i] * scaler) / sscale;
            tmp = MPP_MIN(WORD_CNT_MAX, tmp / 32 + 1);
            if (tmp < 0) tmp = WORD_CNT_MAX;    /* Detect overflow */
            mbrc->cp_target[i] = tmp; /* div32 for regs */
        }
        tmp = axb_div_c(p->bits_per_pic, 256, srcPrm);
    }

    mbrc->cp_error[0] = -tmp * 3;
    mbrc->cp_delta_qp[0] = 3;
    mbrc->cp_error[1] = -tmp * 2;
    mbrc->cp_delta_qp[1] = 2;
    mbrc->cp_error[2] = -tmp * 1;
    mbrc->cp_delta_qp[2] = 1;
    mbrc->cp_error[3] = tmp * 1;
    mbrc->cp_delta_qp[3] = 0;
    mbrc->cp_error[4] = tmp * 2;
    mbrc->cp_delta_qp[4] = -1;
    mbrc->cp_error[5] = tmp * 3;
    mbrc->cp_delta_qp[5] = -2;
    mbrc->cp_error[6] = tmp * 4;
    mbrc->cp_delta_qp[6] = -3;

    for (i = 0; i < VEPU_CTRL_LEVELS; i++) {
        tmp = mbrc->cp_error[i];
        tmp = mpp_clip(tmp / 4, -32768, 32767);
        mbrc->cp_error[i] = tmp;
    }

    mbrc->cp_distance_mbs = p->check_point_distance;

    return MPP_OK;
}